

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void Ssw_RarManAssingRandomPis(Ssw_RarMan_t *p)

{
  void *pvVar1;
  word *pwVar2;
  word wVar3;
  long lVar4;
  int i;
  uint i_00;
  
  for (i_00 = 0; (int)i_00 < p->pAig->nTruePis; i_00 = i_00 + 1) {
    pvVar1 = Vec_PtrEntry(p->pAig->vCis,i_00);
    pwVar2 = Ssw_RarObjSim(p,*(int *)((long)pvVar1 + 0x24));
    for (lVar4 = 0; lVar4 < p->pPars->nWords; lVar4 = lVar4 + 1) {
      wVar3 = Aig_ManRandom64(0);
      pwVar2[lVar4] = wVar3;
    }
    *pwVar2 = *pwVar2 * 0x10 + (ulong)((i_00 & 1) == 0) * 2 + 10;
  }
  return;
}

Assistant:

void Ssw_RarManAssingRandomPis( Ssw_RarMan_t * p )
{
    word * pSim;
    Aig_Obj_t * pObj;
    int w, i;
    Saig_ManForEachPi( p->pAig, pObj, i )
    {
        pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        for ( w = 0; w < p->pPars->nWords; w++ )
            pSim[w] = Aig_ManRandom64(0);
//        pSim[0] <<= 1;
//        pSim[0] = (pSim[0] << 2) | 2;
        pSim[0] = (pSim[0] << 4) | ((i & 1) ? 0xA : 0xC);
    }
}